

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_5bf3::TestCheckArray2DCloseDoesNotHaveSideEffectsWhenFailing::RunImpl
          (TestCheckArray2DCloseDoesNotHaveSideEffectsWhenFailing *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  float local_74;
  float **local_70;
  TestDetails local_68;
  ScopedCurrentTest scopedResults;
  float data [2] [2];
  TestResults testResults;
  
  (anonymous_namespace)::g_sideEffect = 0;
  UnitTest::TestResults::TestResults(&testResults,(TestReporter *)0x0);
  ScopedCurrentTest::ScopedCurrentTest(&scopedResults,&testResults,(TestDetails *)0x0);
  data[0][0] = 0.0;
  data[0][1] = 1.0;
  data[1][0] = 3.0;
  data[1][1] = 3.0;
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  (anonymous_namespace)::g_sideEffect = (anonymous_namespace)::g_sideEffect + 1;
  local_70 = (float **)(anonymous_namespace)::FunctionWithSideEffects3()::data;
  local_74 = 0.01;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_68,*ppTVar3,0x31c);
  UnitTest::CheckArray2DClose<float[2][2],float_const*const*,float>
            (pTVar1,&data,&local_70,2,2,&local_74,&local_68);
  ScopedCurrentTest::~ScopedCurrentTest(&scopedResults);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  testResults.m_testReporter._0_4_ = 1;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_68,*ppTVar3,0x31e);
  UnitTest::CheckEqual<int,int>
            (pTVar1,(int *)&testResults,&(anonymous_namespace)::g_sideEffect,&local_68);
  return;
}

Assistant:

TEST(CheckArray2DCloseDoesNotHaveSideEffectsWhenFailing)
{
    g_sideEffect = 0;
    {
        UnitTest::TestResults testResults;
		ScopedCurrentTest scopedResults(testResults);

		const float data[2][2] = { {0, 1}, {3, 3} };
        CHECK_ARRAY2D_CLOSE (data, FunctionWithSideEffects3(), 2, 2, 0.01f);
    }
    CHECK_EQUAL(1, g_sideEffect);
}